

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O0

void __thiscall Symbol_Table::free_subroutine(Symbol_Table *this)

{
  IdentifierData *this_00;
  bool bVar1;
  reference ppVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>
  *it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
  *__range1;
  Symbol_Table *this_local;
  
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
           ::begin(&this->subroutine_scope);
  it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
          ::end(&this->subroutine_scope);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&it);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>
             ::operator*(&__end1);
    this_00 = ppVar2->second;
    if (this_00 != (IdentifierData *)0x0) {
      IdentifierData::~IdentifierData(this_00);
      operator_delete(this_00,0x48);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Symbol_Table::free_subroutine() {
    for (auto& it : subroutine_scope) {
        delete it.second;
    }
}